

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O1

void write_syms(void)

{
  sym_t *psVar1;
  block_header_t header;
  symbol_entry_t sym;
  block_header_t local_50;
  symbol_entry_t local_48;
  
  if (num_syms != 0) {
    local_50.type = symbols;
    local_50.num_entries = num_syms;
    write_block_header(&local_50);
    cur = root;
    if (root != (sym_t *)0x0) {
      psVar1 = root;
      do {
        local_48.sym_id = psVar1->sym_id;
        cur = psVar1;
        strncpy((char *)local_48.id,psVar1->id,0x20);
        local_48.section_id = psVar1->section_id;
        local_48.offset = psVar1->offset;
        local_48.type = psVar1->type;
        write_symbol_entry(&local_48);
        psVar1 = cur->next;
        cur = psVar1;
      } while (psVar1 != (sym_t *)0x0);
    }
  }
  return;
}

Assistant:

void write_syms()
{
    block_header_t header;
    symbol_entry_t sym;
    if (num_syms == 0)
        return;

    header.type = symbols;
    header.num_entries = num_syms;
    write_block_header(&header);
    cur = root;
    while (cur)
    {
        sym.sym_id = cur->sym_id;
        strncpy((char*)sym.id, cur->id, MAX_ID_LEN + 1);
        sym.section_id = cur->section_id;
        sym.offset = cur->offset;
        sym.type = cur->type;
        write_symbol_entry(&sym);
        cur = cur->next;
    }
}